

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem>::relocate
          (QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem> *this,qsizetype offset,
          LayoutChangeItem **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem> *in_RDI;
  LayoutChangeItem **unaff_retaddr;
  LayoutChangeItem *res;
  LayoutChangeItem *first;
  QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QHeaderViewPrivate::LayoutChangeItem,long_long>
            (first,(longlong)in_RDI,(LayoutChangeItem *)0x84ec57);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem>,QHeaderViewPrivate::LayoutChangeItem_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }